

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimCreator.cpp
# Opt level: O0

void __thiscall OpenMD::SimCreator::setGlobalIndex(SimCreator *this,SimInfo *info)

{
  int iVar1;
  int iVar2;
  int iVar3;
  reference pvVar4;
  size_t sVar5;
  SimInfo *this_00;
  reference ppSVar6;
  SimInfo *in_RSI;
  StuntDouble *sd;
  int globalIO;
  int myGlobalIndex;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> IOIndexToIntegrableObject;
  int i_1;
  int startingIndex;
  vector<int,_std::allocator<int>_> startingIOIndexForMol;
  vector<int,_std::allocator<int>_> numIntegrableObjectsPerMol;
  vector<int,_std::allocator<int>_> nIOPerMol;
  vector<int,_std::allocator<int>_> globalMolMembership;
  vector<int,_std::allocator<int>_> globalGroupMembership;
  int i;
  int beginInversionIndex;
  int beginTorsionIndex;
  int beginBendIndex;
  int beginBondIndex;
  int beginCutoffGroupIndex;
  int beginRigidBodyIndex;
  int beginAtomIndex;
  Inversion *inversion;
  Torsion *torsion;
  Bend *bend;
  Bond *bond;
  CutoffGroup *cg;
  RigidBody *rb;
  Atom *atom;
  Molecule *mol;
  IntegrableObjectIterator ioi;
  InversionIterator ii;
  TorsionIterator ti;
  BendIterator bei;
  BondIterator boi;
  CutoffGroupIterator ci;
  RigidBodyIterator ri;
  AtomIterator ai;
  MoleculeIterator mi;
  SimInfo *in_stack_fffffffffffffd18;
  SimInfo *in_stack_fffffffffffffd20;
  allocator_type *in_stack_fffffffffffffd28;
  SimInfo *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  int in_stack_fffffffffffffd3c;
  SimInfo *in_stack_fffffffffffffd40;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd68;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffffd70;
  SimInfo *local_1a0;
  int local_194;
  vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> local_180;
  int local_164;
  int local_160;
  vector<int,_std::allocator<int>_> local_158;
  vector<int,_std::allocator<int>_> local_140;
  undefined4 local_124;
  vector<int,_std::allocator<int>_> local_120;
  undefined4 local_104;
  vector<int,_std::allocator<int>_> local_100;
  undefined4 local_d4;
  vector<int,_std::allocator<int>_> local_d0;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  Inversion *local_98;
  Torsion *local_90;
  Bend *local_88;
  Bond *local_80;
  CutoffGroup *local_78;
  RigidBody *local_70;
  Atom *local_68;
  SimInfo *local_60;
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  local_58;
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  local_50;
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  local_48;
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  local_40;
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  local_38;
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  local_30;
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  local_28;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_20;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_18;
  SimInfo *local_10;
  
  local_10 = in_RSI;
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_18);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_20);
  __gnu_cxx::
  __normal_iterator<OpenMD::RigidBody_**,_std::vector<OpenMD::RigidBody_*,_std::allocator<OpenMD::RigidBody_*>_>_>
  ::__normal_iterator(&local_28);
  __gnu_cxx::
  __normal_iterator<OpenMD::CutoffGroup_**,_std::vector<OpenMD::CutoffGroup_*,_std::allocator<OpenMD::CutoffGroup_*>_>_>
  ::__normal_iterator(&local_30);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bond_**,_std::vector<OpenMD::Bond_*,_std::allocator<OpenMD::Bond_*>_>_>
  ::__normal_iterator(&local_38);
  __gnu_cxx::
  __normal_iterator<OpenMD::Bend_**,_std::vector<OpenMD::Bend_*,_std::allocator<OpenMD::Bend_*>_>_>
  ::__normal_iterator(&local_40);
  __gnu_cxx::
  __normal_iterator<OpenMD::Torsion_**,_std::vector<OpenMD::Torsion_*,_std::allocator<OpenMD::Torsion_*>_>_>
  ::__normal_iterator(&local_48);
  __gnu_cxx::
  __normal_iterator<OpenMD::Inversion_**,_std::vector<OpenMD::Inversion_*,_std::allocator<OpenMD::Inversion_*>_>_>
  ::__normal_iterator(&local_50);
  __gnu_cxx::
  __normal_iterator<OpenMD::StuntDouble_**,_std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>_>
  ::__normal_iterator(&local_58);
  local_9c = 0;
  local_a0 = SimInfo::getNGlobalAtoms(local_10);
  local_a4 = 0;
  local_a8 = 0;
  local_ac = 0;
  local_b0 = 0;
  local_b4 = 0;
  local_b8 = 0;
  while( true ) {
    iVar2 = local_b8;
    iVar1 = SimInfo::getNGlobalMolecules(local_10);
    if (iVar1 <= iVar2) break;
    local_60 = (SimInfo *)
               SimInfo::getMoleculeByGlobalIndex
                         (in_stack_fffffffffffffd40,in_stack_fffffffffffffd3c);
    local_68 = Molecule::beginAtom((Molecule *)in_stack_fffffffffffffd40,
                                   (iterator *)
                                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    while (iVar2 = local_9c, local_68 != (Atom *)0x0) {
      local_9c = local_9c + 1;
      StuntDouble::setGlobalIndex(&local_68->super_StuntDouble,iVar2);
      local_68 = Molecule::nextAtom((Molecule *)in_stack_fffffffffffffd40,
                                    (iterator *)
                                    CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    }
    local_70 = Molecule::beginRigidBody
                         ((Molecule *)in_stack_fffffffffffffd40,
                          (iterator *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38))
    ;
    while (iVar2 = local_a0, local_70 != (RigidBody *)0x0) {
      local_a0 = local_a0 + 1;
      StuntDouble::setGlobalIndex(&local_70->super_StuntDouble,iVar2);
      local_70 = Molecule::nextRigidBody
                           ((Molecule *)in_stack_fffffffffffffd40,
                            (iterator *)
                            CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    }
    local_78 = Molecule::beginCutoffGroup
                         ((Molecule *)in_stack_fffffffffffffd40,
                          (iterator *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38))
    ;
    while (iVar2 = local_a4, local_78 != (CutoffGroup *)0x0) {
      local_a4 = local_a4 + 1;
      CutoffGroup::setGlobalIndex(local_78,iVar2);
      local_78 = Molecule::nextCutoffGroup
                           ((Molecule *)in_stack_fffffffffffffd40,
                            (iterator *)
                            CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    }
    local_80 = Molecule::beginBond((Molecule *)in_stack_fffffffffffffd40,
                                   (iterator *)
                                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    while (iVar2 = local_a8, local_80 != (Bond *)0x0) {
      local_a8 = local_a8 + 1;
      ShortRangeInteraction::setGlobalIndex(&local_80->super_ShortRangeInteraction,iVar2);
      local_80 = Molecule::nextBond((Molecule *)in_stack_fffffffffffffd40,
                                    (iterator *)
                                    CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    }
    local_88 = Molecule::beginBend((Molecule *)in_stack_fffffffffffffd40,
                                   (iterator *)
                                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    while (iVar2 = local_ac, local_88 != (Bend *)0x0) {
      local_ac = local_ac + 1;
      ShortRangeInteraction::setGlobalIndex(&local_88->super_ShortRangeInteraction,iVar2);
      local_88 = Molecule::nextBend((Molecule *)in_stack_fffffffffffffd40,
                                    (iterator *)
                                    CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    }
    local_90 = Molecule::beginTorsion
                         ((Molecule *)in_stack_fffffffffffffd40,
                          (iterator *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38))
    ;
    while (iVar2 = local_b0, local_90 != (Torsion *)0x0) {
      local_b0 = local_b0 + 1;
      ShortRangeInteraction::setGlobalIndex(&local_90->super_ShortRangeInteraction,iVar2);
      local_90 = Molecule::nextTorsion
                           ((Molecule *)in_stack_fffffffffffffd40,
                            (iterator *)
                            CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    }
    local_98 = Molecule::beginInversion
                         ((Molecule *)in_stack_fffffffffffffd40,
                          (iterator *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38))
    ;
    while (iVar2 = local_b4, local_98 != (Inversion *)0x0) {
      local_b4 = local_b4 + 1;
      ShortRangeInteraction::setGlobalIndex(&local_98->super_ShortRangeInteraction,iVar2);
      local_98 = Molecule::nextInversion
                           ((Molecule *)in_stack_fffffffffffffd40,
                            (iterator *)
                            CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    }
    local_b8 = local_b8 + 1;
  }
  SimInfo::getNGlobalAtoms(local_10);
  local_d4 = 0;
  std::allocator<int>::allocator((allocator<int> *)0x147e45);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd40,
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (value_type_conflict1 *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::allocator<int>::~allocator((allocator<int> *)0x147e79);
  local_60 = (SimInfo *)
             SimInfo::beginMolecule
                       (in_stack_fffffffffffffd40,
                        (MoleculeIterator *)
                        CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  while (local_60 != (SimInfo *)0x0) {
    local_78 = Molecule::beginCutoffGroup
                         ((Molecule *)in_stack_fffffffffffffd40,
                          (iterator *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38))
    ;
    while (local_78 != (CutoffGroup *)0x0) {
      local_68 = CutoffGroup::beginAtom
                           ((CutoffGroup *)in_stack_fffffffffffffd40,
                            (iterator *)
                            CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      while (local_68 != (Atom *)0x0) {
        iVar2 = CutoffGroup::getGlobalIndex(local_78);
        iVar1 = StuntDouble::getGlobalIndex(&local_68->super_StuntDouble);
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_d0,(long)iVar1);
        *pvVar4 = iVar2;
        local_68 = CutoffGroup::nextAtom
                             ((CutoffGroup *)in_stack_fffffffffffffd40,
                              (iterator *)
                              CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      }
      local_78 = Molecule::nextCutoffGroup
                           ((Molecule *)in_stack_fffffffffffffd40,
                            (iterator *)
                            CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    }
    local_60 = (SimInfo *)
               SimInfo::nextMolecule
                         (in_stack_fffffffffffffd40,
                          (MoleculeIterator *)
                          CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  }
  SimInfo::setGlobalGroupMembership
            (in_stack_fffffffffffffd20,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd18);
  SimInfo::getNGlobalAtoms(local_10);
  SimInfo::getNGlobalRigidBodies(local_10);
  local_104 = 0;
  std::allocator<int>::allocator((allocator<int> *)0x1480db);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd40,
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (value_type_conflict1 *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::allocator<int>::~allocator((allocator<int> *)0x14810f);
  local_60 = (SimInfo *)
             SimInfo::beginMolecule
                       (in_stack_fffffffffffffd40,
                        (MoleculeIterator *)
                        CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  while (local_60 != (SimInfo *)0x0) {
    local_68 = Molecule::beginAtom((Molecule *)in_stack_fffffffffffffd40,
                                   (iterator *)
                                   CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    while (local_68 != (Atom *)0x0) {
      iVar2 = Molecule::getGlobalIndex((Molecule *)local_60);
      iVar1 = StuntDouble::getGlobalIndex(&local_68->super_StuntDouble);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_100,(long)iVar1);
      *pvVar4 = iVar2;
      local_68 = Molecule::nextAtom((Molecule *)in_stack_fffffffffffffd40,
                                    (iterator *)
                                    CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    }
    local_70 = Molecule::beginRigidBody
                         ((Molecule *)in_stack_fffffffffffffd40,
                          (iterator *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38))
    ;
    while (local_70 != (RigidBody *)0x0) {
      iVar2 = Molecule::getGlobalIndex((Molecule *)local_60);
      iVar1 = StuntDouble::getGlobalIndex(&local_70->super_StuntDouble);
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_100,(long)iVar1);
      *pvVar4 = iVar2;
      local_70 = Molecule::nextRigidBody
                           ((Molecule *)in_stack_fffffffffffffd40,
                            (iterator *)
                            CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    }
    local_60 = (SimInfo *)
               SimInfo::nextMolecule
                         (in_stack_fffffffffffffd40,
                          (MoleculeIterator *)
                          CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  }
  SimInfo::setGlobalMolMembership
            (in_stack_fffffffffffffd20,
             (vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd18);
  SimInfo::getNGlobalMolecules(local_10);
  local_124 = 0;
  std::allocator<int>::allocator((allocator<int> *)0x14839c);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd40,
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (value_type_conflict1 *)in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
  std::allocator<int>::~allocator((allocator<int> *)0x1483d0);
  local_60 = (SimInfo *)
             SimInfo::beginMolecule
                       (in_stack_fffffffffffffd40,
                        (MoleculeIterator *)
                        CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  while (local_60 != (SimInfo *)0x0) {
    sVar5 = Molecule::getNIntegrableObjects((Molecule *)0x14841b);
    iVar2 = Molecule::getGlobalIndex((Molecule *)local_60);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_120,(long)iVar2);
    *pvVar4 = (value_type)sVar5;
    local_60 = (SimInfo *)
               SimInfo::nextMolecule
                         (in_stack_fffffffffffffd40,
                          (MoleculeIterator *)
                          CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  }
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
  SimInfo::getNGlobalMolecules(local_10);
  std::allocator<int>::allocator((allocator<int> *)0x14850c);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd40,
             CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38),
             (allocator_type *)in_stack_fffffffffffffd30);
  std::allocator<int>::~allocator((allocator<int> *)0x148532);
  local_160 = 0;
  local_164 = 0;
  while( true ) {
    iVar2 = local_164;
    iVar3 = SimInfo::getNGlobalMolecules(local_10);
    iVar1 = local_160;
    if (iVar3 <= iVar2) break;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_158,(long)local_164);
    *pvVar4 = iVar1;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_140,(long)local_164);
    local_160 = *pvVar4 + local_160;
    local_164 = local_164 + 1;
  }
  SimInfo::getNGlobalIntegrableObjects(local_10);
  std::allocator<OpenMD::StuntDouble_*>::allocator((allocator<OpenMD::StuntDouble_*> *)0x14866b);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
             in_stack_fffffffffffffd40,CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38)
             ,(value_type *)in_stack_fffffffffffffd30,(allocator_type *)in_stack_fffffffffffffd28);
  std::allocator<OpenMD::StuntDouble_*>::~allocator((allocator<OpenMD::StuntDouble_*> *)0x148699);
  this_00 = (SimInfo *)
            SimInfo::beginMolecule
                      (in_stack_fffffffffffffd40,
                       (MoleculeIterator *)
                       CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
  local_60 = this_00;
  while (local_60 != (SimInfo *)0x0) {
    iVar2 = Molecule::getGlobalIndex((Molecule *)local_60);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[](&local_158,(long)iVar2);
    local_194 = *pvVar4;
    in_stack_fffffffffffffd30 =
         (SimInfo *)
         Molecule::beginIntegrableObject
                   ((Molecule *)this_00,(iterator *)CONCAT44(iVar2,in_stack_fffffffffffffd38));
    local_1a0 = in_stack_fffffffffffffd30;
    while (local_1a0 != (SimInfo *)0x0) {
      StuntDouble::setGlobalIntegrableObjectIndex((StuntDouble *)local_1a0,local_194);
      ppSVar6 = std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::
                operator[](&local_180,(long)local_194);
      *ppSVar6 = (value_type)local_1a0;
      local_194 = local_194 + 1;
      in_stack_fffffffffffffd20 =
           (SimInfo *)
           Molecule::nextIntegrableObject
                     ((Molecule *)this_00,(iterator *)CONCAT44(iVar2,in_stack_fffffffffffffd38));
      local_1a0 = in_stack_fffffffffffffd20;
    }
    in_stack_fffffffffffffd18 =
         (SimInfo *)
         SimInfo::nextMolecule
                   (this_00,(MoleculeIterator *)CONCAT44(iVar2,in_stack_fffffffffffffd38));
    local_60 = in_stack_fffffffffffffd18;
  }
  SimInfo::setIOIndexToIntegrableObject
            (in_stack_fffffffffffffd20,
             (vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
             in_stack_fffffffffffffd18);
  std::vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_>::~vector
            ((vector<OpenMD::StuntDouble_*,_std::allocator<OpenMD::StuntDouble_*>_> *)
             in_stack_fffffffffffffd30);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffd30);
  return;
}

Assistant:

void SimCreator::setGlobalIndex(SimInfo* info) {
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    Molecule::RigidBodyIterator ri;
    Molecule::CutoffGroupIterator ci;
    Molecule::BondIterator boi;
    Molecule::BendIterator bei;
    Molecule::TorsionIterator ti;
    Molecule::InversionIterator ii;
    Molecule::IntegrableObjectIterator ioi;
    Molecule* mol;
    Atom* atom;
    RigidBody* rb;
    CutoffGroup* cg;
    Bond* bond;
    Bend* bend;
    Torsion* torsion;
    Inversion* inversion;
    int beginAtomIndex;
    int beginRigidBodyIndex;
    int beginCutoffGroupIndex;
    int beginBondIndex;
    int beginBendIndex;
    int beginTorsionIndex;
    int beginInversionIndex;
#ifdef IS_MPI
    int nGlobalAtoms       = info->getNGlobalAtoms();
    int nGlobalRigidBodies = info->getNGlobalRigidBodies();
#endif

    beginAtomIndex = 0;
    // The rigid body indices begin immediately after the atom indices:
    beginRigidBodyIndex   = info->getNGlobalAtoms();
    beginCutoffGroupIndex = 0;
    beginBondIndex        = 0;
    beginBendIndex        = 0;
    beginTorsionIndex     = 0;
    beginInversionIndex   = 0;

    for (int i = 0; i < info->getNGlobalMolecules(); i++) {
#ifdef IS_MPI
      if (info->getMolToProc(i) == worldRank) {
#endif
        // stuff to do if I own this molecule
        mol = info->getMoleculeByGlobalIndex(i);

        // The local index(index in DataStorge) of the atom is important:
        for (atom = mol->beginAtom(ai); atom != NULL;
             atom = mol->nextAtom(ai)) {
          atom->setGlobalIndex(beginAtomIndex++);
        }

        for (rb = mol->beginRigidBody(ri); rb != NULL;
             rb = mol->nextRigidBody(ri)) {
          rb->setGlobalIndex(beginRigidBodyIndex++);
        }

        // The local index of other objects only depends on the order
        // of traversal:
        for (cg = mol->beginCutoffGroup(ci); cg != NULL;
             cg = mol->nextCutoffGroup(ci)) {
          cg->setGlobalIndex(beginCutoffGroupIndex++);
        }
        for (bond = mol->beginBond(boi); bond != NULL;
             bond = mol->nextBond(boi)) {
          bond->setGlobalIndex(beginBondIndex++);
        }
        for (bend = mol->beginBend(bei); bend != NULL;
             bend = mol->nextBend(bei)) {
          bend->setGlobalIndex(beginBendIndex++);
        }
        for (torsion = mol->beginTorsion(ti); torsion != NULL;
             torsion = mol->nextTorsion(ti)) {
          torsion->setGlobalIndex(beginTorsionIndex++);
        }
        for (inversion = mol->beginInversion(ii); inversion != NULL;
             inversion = mol->nextInversion(ii)) {
          inversion->setGlobalIndex(beginInversionIndex++);
        }

#ifdef IS_MPI
      } else {
        // stuff to do if I don't own this molecule

        int stampId          = info->getMoleculeStampId(i);
        MoleculeStamp* stamp = info->getMoleculeStamp(stampId);

        beginAtomIndex += stamp->getNAtoms();
        beginRigidBodyIndex += stamp->getNRigidBodies();
        beginCutoffGroupIndex +=
            stamp->getNCutoffGroups() + stamp->getNFreeAtoms();
        beginBondIndex += stamp->getNBonds();
        beginBendIndex += stamp->getNBends();
        beginTorsionIndex += stamp->getNTorsions();
        beginInversionIndex += stamp->getNInversions();
      }
#endif

    }  // end for(int i=0)

    // fill globalGroupMembership
    std::vector<int> globalGroupMembership(info->getNGlobalAtoms(), 0);
    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      for (cg = mol->beginCutoffGroup(ci); cg != NULL;
           cg = mol->nextCutoffGroup(ci)) {
        for (atom = cg->beginAtom(ai); atom != NULL; atom = cg->nextAtom(ai)) {
          globalGroupMembership[atom->getGlobalIndex()] = cg->getGlobalIndex();
        }
      }
    }

#ifdef IS_MPI
    // Since the globalGroupMembership has been zero filled and we've only
    // poked values into the atoms we know, we can do an Allreduce
    // to get the full globalGroupMembership array (We think).
    // This would be prettier if we could use MPI_IN_PLACE like the MPI-2
    // docs said we could.
    std::vector<int> tmpGroupMembership(info->getNGlobalAtoms(), 0);
    MPI_Allreduce(&globalGroupMembership[0], &tmpGroupMembership[0],
                  nGlobalAtoms, MPI_INT, MPI_SUM, MPI_COMM_WORLD);

    info->setGlobalGroupMembership(tmpGroupMembership);
#else
    info->setGlobalGroupMembership(globalGroupMembership);
#endif

    // fill molMembership
    std::vector<int> globalMolMembership(
        info->getNGlobalAtoms() + info->getNGlobalRigidBodies(), 0);

    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        globalMolMembership[atom->getGlobalIndex()] = mol->getGlobalIndex();
      }
      for (rb = mol->beginRigidBody(ri); rb != NULL;
           rb = mol->nextRigidBody(ri)) {
        globalMolMembership[rb->getGlobalIndex()] = mol->getGlobalIndex();
      }
    }

#ifdef IS_MPI
    std::vector<int> tmpMolMembership(
        info->getNGlobalAtoms() + info->getNGlobalRigidBodies(), 0);
    MPI_Allreduce(&globalMolMembership[0], &tmpMolMembership[0],
                  nGlobalAtoms + nGlobalRigidBodies, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);

    info->setGlobalMolMembership(tmpMolMembership);
#else
    info->setGlobalMolMembership(globalMolMembership);
#endif

    // nIOPerMol holds the number of integrable objects per molecule
    // here the molecules are listed by their global indices.

    std::vector<int> nIOPerMol(info->getNGlobalMolecules(), 0);
    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      nIOPerMol[mol->getGlobalIndex()] = mol->getNIntegrableObjects();
    }

#ifdef IS_MPI
    std::vector<int> numIntegrableObjectsPerMol(info->getNGlobalMolecules(), 0);
    MPI_Allreduce(&nIOPerMol[0], &numIntegrableObjectsPerMol[0],
                  info->getNGlobalMolecules(), MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);
#else
    std::vector<int> numIntegrableObjectsPerMol = nIOPerMol;
#endif

    std::vector<int> startingIOIndexForMol(info->getNGlobalMolecules());

    int startingIndex = 0;
    for (int i = 0; i < info->getNGlobalMolecules(); i++) {
      startingIOIndexForMol[i] = startingIndex;
      startingIndex += numIntegrableObjectsPerMol[i];
    }

    std::vector<StuntDouble*> IOIndexToIntegrableObject(
        info->getNGlobalIntegrableObjects(), (StuntDouble*)NULL);
    for (mol = info->beginMolecule(mi); mol != NULL;
         mol = info->nextMolecule(mi)) {
      int myGlobalIndex = mol->getGlobalIndex();
      int globalIO      = startingIOIndexForMol[myGlobalIndex];
      for (StuntDouble* sd = mol->beginIntegrableObject(ioi); sd != NULL;
           sd              = mol->nextIntegrableObject(ioi)) {
        sd->setGlobalIntegrableObjectIndex(globalIO);
        IOIndexToIntegrableObject[globalIO] = sd;
        globalIO++;
      }
    }

    info->setIOIndexToIntegrableObject(IOIndexToIntegrableObject);
  }